

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O0

void ut::are_equal<agge::point<float>,2ul,agge::pod_vector<agge::point<float>>>
               (point<float> (*expected) [2],pod_vector<agge::point<float>_> *actual,
               LocationInfo *location)

{
  pod_vector<agge::point<float>_> *__first1;
  bool value;
  const_iterator ppVar1;
  const_iterator __last;
  point<float> **__last1;
  unsigned_long local_30 [2];
  LocationInfo *local_20;
  LocationInfo *location_local;
  pod_vector<agge::point<float>_> *actual_local;
  point<float> (*expected_local) [2];
  
  local_30[1] = 2;
  local_20 = location;
  location_local = (LocationInfo *)actual;
  actual_local = (pod_vector<agge::point<float>_> *)expected;
  ppVar1 = agge::pod_vector<agge::point<float>_>::begin(actual);
  __last = agge::pod_vector<agge::point<float>_>::end
                     ((pod_vector<agge::point<float>_> *)location_local);
  local_30[0] = std::distance<agge::point<float>const*>(ppVar1,__last);
  are_equal<unsigned_long,unsigned_long>(local_30 + 1,local_30,local_20);
  __first1 = actual_local;
  __last1 = &actual_local->_limit;
  ppVar1 = agge::pod_vector<agge::point<float>_>::begin
                     ((pod_vector<agge::point<float>_> *)location_local);
  value = std::equal<agge::point<float>*,agge::point<float>const*>
                    ((point<float> *)__first1,(point<float> *)__last1,ppVar1);
  is_true(value,local_20);
  return;
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}